

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
          (PipelineResourceSignatureDescWrapper *this)

{
  pointer pIVar1;
  pointer pPVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->m_StringPool)._M_h);
  pIVar1 = (this->m_ImmutableSamplers).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)(this->m_ImmutableSamplers).
                                 super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar1);
  }
  pPVar2 = (this->m_Resources).
           super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 != (pointer)0x0) {
    operator_delete(pPVar2,(long)(this->m_Resources).
                                 super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar2);
  }
  pcVar3 = (this->m_CombinedSamplerSuffix)._M_dataplus._M_p;
  paVar4 = &(this->m_CombinedSamplerSuffix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_Name)._M_dataplus._M_p;
  paVar4 = &(this->m_Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PipelineResourceSignatureDescWrapper() = default;